

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O2

btVector3 __thiscall btQuantizedBvh::unQuantize(btQuantizedBvh *this,unsigned_short *vecIn)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  btVector3 bVar4;
  
  bVar4.m_floats[0] =
       (float)*vecIn / (this->m_bvhQuantization).m_floats[0] + (this->m_bvhAabbMin).m_floats[0];
  auVar2._0_4_ = (float)(*(uint *)(vecIn + 1) & 0xffff);
  auVar2._4_4_ = (float)(*(uint *)(vecIn + 1) >> 0x10);
  auVar2._8_8_ = 0;
  uVar1 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)((this->m_bvhQuantization).m_floats + 1);
  auVar3 = divps(auVar2,auVar3);
  bVar4.m_floats[1] = auVar3._0_4_ + (float)uVar1;
  bVar4.m_floats[2] = auVar3._4_4_ + (float)((ulong)uVar1 >> 0x20);
  bVar4.m_floats[3] = 0.0;
  return (btVector3)bVar4.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3	unQuantize(const unsigned short* vecIn) const
	{
			btVector3	vecOut;
			vecOut.setValue(
			(btScalar)(vecIn[0]) / (m_bvhQuantization.getX()),
			(btScalar)(vecIn[1]) / (m_bvhQuantization.getY()),
			(btScalar)(vecIn[2]) / (m_bvhQuantization.getZ()));
			vecOut += m_bvhAabbMin;
			return vecOut;
	}